

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-stb-image.h
# Opt level: O2

int stbi__create_png_image_raw
              (stbi__png *a,stbi_uc *raw,stbi__uint32 raw_len,int out_n,stbi__uint32 x,
              stbi__uint32 y,int depth,int color)

{
  byte *__src;
  byte bVar1;
  int a_00;
  stbi__uint32 sVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  stbi_uc *psVar6;
  char *pcVar7;
  void *__ptr;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  byte bVar12;
  size_t sVar13;
  byte bVar14;
  uint uVar15;
  size_t __n;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  ushort *dest;
  char cVar19;
  uint uVar20;
  ulong uVar21;
  ushort *src;
  uint a_01;
  size_t __n_00;
  uint uVar22;
  long in_FS_OFFSET;
  bool bVar23;
  byte local_b1;
  ulong local_60;
  int local_58;
  
  bVar23 = depth == 0x10;
  iVar3 = x * out_n << bVar23;
  a_00 = a->s->img_n;
  uVar22 = a_00 << bVar23;
  if (a_00 + 1 != out_n && a_00 != out_n) {
    __assert_fail("out_n == s->img_n || out_n == s->img_n+1",
                  "/workspace/llm4binary/github/license_c_cmakelists/sammycage[P]plutosvg/plutovg/source/plutovg-stb-image.h"
                  ,0x1267,
                  "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                 );
  }
  psVar6 = (stbi_uc *)stbi__malloc_mad3(x,y,out_n << bVar23,0);
  a->out = psVar6;
  if (psVar6 == (stbi_uc *)0x0) {
LAB_00117184:
    pcVar7 = "outofmem";
  }
  else {
    iVar4 = stbi__mad3sizes_valid(a_00,x,depth,7);
    if (iVar4 != 0) {
      uVar20 = a_00 * x;
      a_01 = uVar20 * depth + 7 >> 3;
      iVar4 = stbi__mad2sizes_valid(a_01,y,a_01);
      if (iVar4 != 0) {
        if (raw_len < (a_01 + 1) * y) {
          pcVar7 = "not enough pixels";
          goto LAB_0011718b;
        }
        local_60 = 0;
        __ptr = stbi__malloc_mad2(a_01,2,0);
        if (__ptr != (void *)0x0) {
          sVar2 = x;
          if (depth < 8) {
            uVar22 = 1;
            sVar2 = a_01;
          }
          uVar5 = sVar2 * uVar22;
          __n = (size_t)(int)uVar22;
          __n_00 = (size_t)(int)uVar5;
          uVar21 = 0;
          if (0 < (int)uVar22) {
            uVar21 = (ulong)uVar22;
          }
          uVar8 = 0;
          if (0 < (int)uVar5) {
            uVar8 = (ulong)uVar5;
          }
          local_b1 = 1;
          uVar11 = 0;
          do {
            if (uVar11 == y) {
              uVar22 = 1;
LAB_001171c9:
              free(__ptr);
              return uVar22;
            }
            uVar9 = 0;
            if ((uVar11 & 1) != 0) {
              uVar9 = (ulong)a_01;
            }
            bVar12 = *raw;
            if (4 < (ulong)bVar12) {
              uVar22 = (uint)(y <= uVar11);
              *(char **)(in_FS_OFFSET + -8) = "invalid filter";
              goto LAB_001171c9;
            }
            if (uVar11 == 0) {
              bVar12 = ""[bVar12];
            }
            src = (ushort *)(uVar9 + (long)__ptr);
            psVar6 = a->out;
            __src = raw + 1;
            if (bVar12 < 6) {
              uVar22 = (local_b1 & 1) * a_01;
              switch(bVar12) {
              case 0:
                memcpy(src,__src,__n_00);
                break;
              case 1:
                memcpy(src,__src,__n);
                lVar10 = 0;
                for (sVar13 = __n; (long)sVar13 < (long)__n_00; sVar13 = sVar13 + 1) {
                  *(byte *)((long)src + sVar13) = *(byte *)((long)src + lVar10) + raw[sVar13 + 1];
                  lVar10 = lVar10 + 1;
                }
                break;
              case 2:
                for (uVar9 = 0; uVar8 != uVar9; uVar9 = uVar9 + 1) {
                  *(stbi_uc *)((long)src + uVar9) =
                       *(char *)((long)__ptr + uVar9 + uVar22) + raw[uVar9 + 1];
                }
                break;
              case 3:
                for (uVar9 = 0; uVar21 != uVar9; uVar9 = uVar9 + 1) {
                  *(byte *)((long)src + uVar9) =
                       (*(byte *)((long)__ptr + uVar9 + uVar22) >> 1) + raw[uVar9 + 1];
                }
                lVar10 = 0;
                for (sVar13 = __n; (long)sVar13 < (long)__n_00; sVar13 = sVar13 + 1) {
                  *(stbi_uc *)((long)src + sVar13) =
                       (char)((uint)*(byte *)((long)src + lVar10) +
                              (uint)*(byte *)((long)__ptr + sVar13 + uVar22) >> 1) + raw[sVar13 + 1]
                  ;
                  lVar10 = lVar10 + 1;
                }
                break;
              case 4:
                for (uVar9 = 0; uVar21 != uVar9; uVar9 = uVar9 + 1) {
                  *(stbi_uc *)((long)src + uVar9) =
                       *(char *)((long)__ptr + uVar9 + uVar22) + raw[uVar9 + 1];
                }
                lVar10 = 0;
                for (sVar13 = __n; (long)sVar13 < (long)__n_00; sVar13 = sVar13 + 1) {
                  bVar12 = *(byte *)((long)src + lVar10);
                  bVar14 = *(byte *)((long)__ptr + sVar13 + uVar22);
                  bVar1 = *(byte *)((long)__ptr + lVar10 + (ulong)uVar22);
                  uVar17 = (uint)bVar14;
                  uVar15 = (uint)bVar12;
                  iVar4 = (((uint)bVar1 + (uint)bVar1 * 2) - uVar17) - uVar15;
                  uVar18 = (uint)bVar14;
                  uVar5 = uVar18;
                  if (uVar15 < uVar17) {
                    uVar5 = (uint)bVar12;
                  }
                  if (uVar15 >= uVar17 && uVar15 != uVar18) {
                    uVar18 = (uint)bVar12;
                  }
                  uVar15 = (uint)bVar1;
                  if ((int)uVar18 <= iVar4) {
                    uVar15 = uVar5;
                  }
                  cVar19 = (char)uVar15;
                  if (iVar4 <= (int)uVar5) {
                    cVar19 = (char)uVar18;
                  }
                  *(stbi_uc *)((long)src + sVar13) = cVar19 + raw[sVar13 + 1];
                  lVar10 = lVar10 + 1;
                }
                break;
              case 5:
                memcpy(src,__src,__n);
                lVar10 = 0;
                for (sVar13 = __n; (long)sVar13 < (long)__n_00; sVar13 = sVar13 + 1) {
                  *(byte *)((long)src + sVar13) =
                       (*(byte *)((long)src + lVar10) >> 1) + raw[sVar13 + 1];
                  lVar10 = lVar10 + 1;
                }
              }
            }
            local_58 = (int)uVar11;
            dest = (ushort *)(psVar6 + (uint)(iVar3 * local_58));
            if (depth < 8) {
              bVar12 = 1;
              if (color == 0) {
                bVar12 = ""[depth];
              }
              if (depth == 4) {
                uVar16 = 0;
                for (uVar9 = 0; uVar20 != (uint)uVar9; uVar9 = uVar9 + 1) {
                  if ((uVar9 & 1) == 0) {
                    uVar16 = (ulong)(byte)*src;
                    src = (ushort *)((long)src + 1);
                  }
                  psVar6[uVar9 + local_60] = (char)(uVar16 >> 4) * bVar12;
                  uVar16 = (ulong)(byte)((char)uVar16 << 4);
                }
              }
              else if (depth == 2) {
                uVar16 = 0;
                for (uVar9 = 0; uVar20 != (uint)uVar9; uVar9 = uVar9 + 1) {
                  if ((uVar9 & 3) == 0) {
                    uVar16 = (ulong)(byte)*src;
                    src = (ushort *)((long)src + 1);
                  }
                  psVar6[uVar9 + local_60] = (char)(uVar16 >> 6) * bVar12;
                  uVar16 = (ulong)(byte)((char)uVar16 << 2);
                }
              }
              else {
                if (depth != 1) {
                  __assert_fail("depth == 1",
                                "/workspace/llm4binary/github/license_c_cmakelists/sammycage[P]plutosvg/plutovg/source/plutovg-stb-image.h"
                                ,0x12cb,
                                "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                               );
                }
                bVar14 = 0;
                for (uVar9 = 0; uVar20 != (uint)uVar9; uVar9 = uVar9 + 1) {
                  if ((uVar9 & 7) == 0) {
                    bVar14 = (byte)*src;
                    src = (ushort *)((long)src + 1);
                  }
                  psVar6[uVar9 + local_60] = (char)bVar14 >> 7 & bVar12;
                  bVar14 = bVar14 * '\x02';
                }
              }
              src = dest;
              if (a_00 != out_n) {
LAB_00116f76:
                stbi__create_png_alpha_expand8((stbi_uc *)dest,(stbi_uc *)src,x,a_00);
              }
            }
            else if (depth == 8) {
              if (a_00 != out_n) goto LAB_00116f76;
              memcpy(dest,src,(ulong)uVar20);
            }
            else if (depth == 0x10) {
              if (a_00 == out_n) {
                for (lVar10 = 0; uVar20 != (uint)lVar10; lVar10 = lVar10 + 1) {
                  *(ushort *)(psVar6 + lVar10 * 2 + local_60) = src[lVar10] << 8 | src[lVar10] >> 8;
                }
              }
              else {
                if (a_00 + 1 != out_n) {
                  __assert_fail("img_n+1 == out_n",
                                "/workspace/llm4binary/github/license_c_cmakelists/sammycage[P]plutosvg/plutovg/source/plutovg-stb-image.h"
                                ,0x12e4,
                                "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                               );
                }
                if (a_00 == 1) {
                  for (lVar10 = 0; x != (stbi__uint32)lVar10; lVar10 = lVar10 + 1) {
                    *(ushort *)(psVar6 + lVar10 * 4 + local_60) =
                         src[lVar10] << 8 | src[lVar10] >> 8;
                    (psVar6 + lVar10 * 4 + local_60 + 2)[0] = 0xff;
                    (psVar6 + lVar10 * 4 + local_60 + 2)[1] = 0xff;
                  }
                }
                else {
                  if (a_00 != 3) {
                    __assert_fail("img_n == 3",
                                  "/workspace/llm4binary/github/license_c_cmakelists/sammycage[P]plutosvg/plutovg/source/plutovg-stb-image.h"
                                  ,0x12eb,
                                  "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                                 );
                  }
                  for (lVar10 = 0; x != (stbi__uint32)lVar10; lVar10 = lVar10 + 1) {
                    *(ushort *)(psVar6 + lVar10 * 8 + local_60) = *src << 8 | *src >> 8;
                    *(ushort *)(psVar6 + lVar10 * 8 + local_60 + 2) = src[1] << 8 | src[1] >> 8;
                    *(ushort *)(psVar6 + lVar10 * 8 + local_60 + 4) = src[2] << 8 | src[2] >> 8;
                    (psVar6 + lVar10 * 8 + local_60 + 6)[0] = 0xff;
                    (psVar6 + lVar10 * 8 + local_60 + 6)[1] = 0xff;
                    src = src + 3;
                  }
                }
              }
            }
            raw = __src + __n_00;
            uVar11 = uVar11 + 1;
            local_b1 = local_b1 + 1;
            local_60 = (ulong)(uint)((int)local_60 + iVar3);
          } while( true );
        }
        goto LAB_00117184;
      }
    }
    pcVar7 = "too large";
  }
LAB_0011718b:
  *(char **)(in_FS_OFFSET + -8) = pcVar7;
  return 0;
}

Assistant:

static int stbi__create_png_image_raw(stbi__png *a, stbi_uc *raw, stbi__uint32 raw_len, int out_n, stbi__uint32 x, stbi__uint32 y, int depth, int color)
{
   int bytes = (depth == 16 ? 2 : 1);
   stbi__context *s = a->s;
   stbi__uint32 i,j,stride = x*out_n*bytes;
   stbi__uint32 img_len, img_width_bytes;
   stbi_uc *filter_buf;
   int all_ok = 1;
   int k;
   int img_n = s->img_n; // copy it into a local for later

   int output_bytes = out_n*bytes;
   int filter_bytes = img_n*bytes;
   int width = x;

   STBI_ASSERT(out_n == s->img_n || out_n == s->img_n+1);
   a->out = (stbi_uc *) stbi__malloc_mad3(x, y, output_bytes, 0); // extra bytes to write off the end into
   if (!a->out) return stbi__err("outofmem", "Out of memory");

   // note: error exits here don't need to clean up a->out individually,
   // stbi__do_png always does on error.
   if (!stbi__mad3sizes_valid(img_n, x, depth, 7)) return stbi__err("too large", "Corrupt PNG");
   img_width_bytes = (((img_n * x * depth) + 7) >> 3);
   if (!stbi__mad2sizes_valid(img_width_bytes, y, img_width_bytes)) return stbi__err("too large", "Corrupt PNG");
   img_len = (img_width_bytes + 1) * y;

   // we used to check for exact match between raw_len and img_len on non-interlaced PNGs,
   // but issue #276 reported a PNG in the wild that had extra data at the end (all zeros),
   // so just check for raw_len < img_len always.
   if (raw_len < img_len) return stbi__err("not enough pixels","Corrupt PNG");

   // Allocate two scan lines worth of filter workspace buffer.
   filter_buf = (stbi_uc *) stbi__malloc_mad2(img_width_bytes, 2, 0);
   if (!filter_buf) return stbi__err("outofmem", "Out of memory");

   // Filtering for low-bit-depth images
   if (depth < 8) {
      filter_bytes = 1;
      width = img_width_bytes;
   }

   for (j=0; j < y; ++j) {
      // cur/prior filter buffers alternate
      stbi_uc *cur = filter_buf + (j & 1)*img_width_bytes;
      stbi_uc *prior = filter_buf + (~j & 1)*img_width_bytes;
      stbi_uc *dest = a->out + stride*j;
      int nk = width * filter_bytes;
      int filter = *raw++;

      // check filter type
      if (filter > 4) {
         all_ok = stbi__err("invalid filter","Corrupt PNG");
         break;
      }

      // if first row, use special filter that doesn't sample previous row
      if (j == 0) filter = first_row_filter[filter];

      // perform actual filtering
      switch (filter) {
      case STBI__F_none:
         memcpy(cur, raw, nk);
         break;
      case STBI__F_sub:
         memcpy(cur, raw, filter_bytes);
         for (k = filter_bytes; k < nk; ++k)
            cur[k] = STBI__BYTECAST(raw[k] + cur[k-filter_bytes]);
         break;
      case STBI__F_up:
         for (k = 0; k < nk; ++k)
            cur[k] = STBI__BYTECAST(raw[k] + prior[k]);
         break;
      case STBI__F_avg:
         for (k = 0; k < filter_bytes; ++k)
            cur[k] = STBI__BYTECAST(raw[k] + (prior[k]>>1));
         for (k = filter_bytes; k < nk; ++k)
            cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k-filter_bytes])>>1));
         break;
      case STBI__F_paeth:
         for (k = 0; k < filter_bytes; ++k)
            cur[k] = STBI__BYTECAST(raw[k] + prior[k]); // prior[k] == stbi__paeth(0,prior[k],0)
         for (k = filter_bytes; k < nk; ++k)
            cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes], prior[k], prior[k-filter_bytes]));
         break;
      case STBI__F_avg_first:
         memcpy(cur, raw, filter_bytes);
         for (k = filter_bytes; k < nk; ++k)
            cur[k] = STBI__BYTECAST(raw[k] + (cur[k-filter_bytes] >> 1));
         break;
      }

      raw += nk;

      // expand decoded bits in cur to dest, also adding an extra alpha channel if desired
      if (depth < 8) {
         stbi_uc scale = (color == 0) ? stbi__depth_scale_table[depth] : 1; // scale grayscale values to 0..255 range
         stbi_uc *in = cur;
         stbi_uc *out = dest;
         stbi_uc inb = 0;
         stbi__uint32 nsmp = x*img_n;

         // expand bits to bytes first
         if (depth == 4) {
            for (i=0; i < nsmp; ++i) {
               if ((i & 1) == 0) inb = *in++;
               *out++ = scale * (inb >> 4);
               inb <<= 4;
            }
         } else if (depth == 2) {
            for (i=0; i < nsmp; ++i) {
               if ((i & 3) == 0) inb = *in++;
               *out++ = scale * (inb >> 6);
               inb <<= 2;
            }
         } else {
            STBI_ASSERT(depth == 1);
            for (i=0; i < nsmp; ++i) {
               if ((i & 7) == 0) inb = *in++;
               *out++ = scale * (inb >> 7);
               inb <<= 1;
            }
         }

         // insert alpha=255 values if desired
         if (img_n != out_n)
            stbi__create_png_alpha_expand8(dest, dest, x, img_n);
      } else if (depth == 8) {
         if (img_n == out_n)
            memcpy(dest, cur, x*img_n);
         else
            stbi__create_png_alpha_expand8(dest, cur, x, img_n);
      } else if (depth == 16) {
         // convert the image data from big-endian to platform-native
         stbi__uint16 *dest16 = (stbi__uint16*)dest;
         stbi__uint32 nsmp = x*img_n;

         if (img_n == out_n) {
            for (i = 0; i < nsmp; ++i, ++dest16, cur += 2)
               *dest16 = (cur[0] << 8) | cur[1];
         } else {
            STBI_ASSERT(img_n+1 == out_n);
            if (img_n == 1) {
               for (i = 0; i < x; ++i, dest16 += 2, cur += 2) {
                  dest16[0] = (cur[0] << 8) | cur[1];
                  dest16[1] = 0xffff;
               }
            } else {
               STBI_ASSERT(img_n == 3);
               for (i = 0; i < x; ++i, dest16 += 4, cur += 6) {
                  dest16[0] = (cur[0] << 8) | cur[1];
                  dest16[1] = (cur[2] << 8) | cur[3];
                  dest16[2] = (cur[4] << 8) | cur[5];
                  dest16[3] = 0xffff;
               }
            }
         }
      }
   }

   STBI_FREE(filter_buf);
   if (!all_ok) return 0;

   return 1;
}